

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hpp
# Opt level: O0

ostream * operator<<(ostream *out,
                    EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
                    *solution)

{
  bool bVar1;
  char *pcVar2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  *this;
  size_type sVar3;
  ostream *poVar4;
  int in_EDX;
  variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
  *in_RSI;
  ostream *in_RDI;
  int i;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  *vals;
  size_t index;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_00000048;
  ostream *in_stack_00000050;
  SpecificSolution *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  int local_24;
  
  pcVar2 = std::
           variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
           ::index(in_RSI,(char *)in_RSI,in_EDX);
  if (pcVar2 == (char *)0x0) {
    this = std::
           get<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
                     ((variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
                       *)0x117823);
    std::operator<<(in_RDI,"(");
    sVar3 = std::
            vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
            ::size(this);
    local_24 = (int)sVar3;
    while (local_24 = local_24 + -1, 0 < local_24) {
      in_stack_ffffffffffffffd0 = in_RDI;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::operator[](this,(long)local_24);
      poVar4 = boost::multiprecision::operator<<(in_stack_00000050,in_stack_00000048);
      std::operator<<(poVar4,", ");
    }
    bVar1 = std::
            vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
            ::empty((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                     *)in_stack_ffffffffffffffd0);
    if (!bVar1) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::operator[](this,0);
      boost::multiprecision::operator<<(in_stack_00000050,in_stack_00000048);
    }
    std::operator<<(in_RDI,")");
  }
  else {
    std::
    get<SpecificSolution,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
              ((variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
                *)0x1178ed);
    operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const EquationSolution<ValueType> &solution) {
    std::size_t index = solution.index();
    if (index == 0) {
        const std::vector<ValueType> &vals = std::get<std::vector<ValueType> >(solution);
        out << "(";
        for (int i = int(vals.size()) - 1; i > 0; i--) {
            out << vals[i] << ", ";
        }
        //make sure that we don't have an extra ',' at the end
        if (!vals.empty()) {
            out << vals[0];
        }
        out << ")";
    } else {
        out << std::get<SpecificSolution>(solution);
    }
    return out;
}